

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# returnperiodtobin.cpp
# Opt level: O0

void doit(void)

{
  int iVar1;
  char *pcVar2;
  uint local_101c;
  char local_1018 [4];
  int lineno;
  char line [4096];
  value_type local_c [2];
  int return_period;
  
  local_101c = 0;
  fgets(local_1018,0x1000,_stdin);
  while( true ) {
    pcVar2 = fgets(local_1018,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      writereturnperiods();
      return;
    }
    iVar1 = __isoc99_sscanf(local_1018,"%d",local_c);
    if (iVar1 != 1) break;
    std::vector<int,_std::allocator<int>_>::push_back(&return_periods,local_c);
    local_101c = local_101c + 1;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)local_101c,local_1018);
  return;
}

Assistant:

void doit()
{
    int return_period;
    char line[4096];
    int lineno=0;
	fgets(line, sizeof(line), stdin);	// skip first line
    while (fgets(line, sizeof(line), stdin) != 0)
    {
       if (sscanf(line, "%d", &return_period) != 1){
           fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
           return;
       }
       else
       {           
		   return_periods.push_back(return_period);
       }
       lineno++;
    }
	writereturnperiods();
}